

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

uint32_t __thiscall
cppnet::Dispatcher::AddTimer
          (Dispatcher *this,user_timer_call_back *cb,void *param,uint32_t interval,bool always)

{
  uint16_t *puVar1;
  _Atomic_word *p_Var2;
  element_type *peVar3;
  TimerEvent *pTVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar5;
  pthread_t pVar6;
  mapped_type *pmVar7;
  uint uVar8;
  long *in_FS_OFFSET;
  shared_ptr<cppnet::TimerEvent> event;
  TimerEvent *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [16];
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  TimerSlot *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined4 local_37;
  undefined3 uStack_33;
  
  local_78 = (TimerEvent *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerEvent,std::allocator<cppnet::TimerEvent>>
            (&local_70,&local_78,(allocator<cppnet::TimerEvent> *)local_68);
  puVar1 = &(local_78->super_Event)._event_type;
  *puVar1 = *puVar1 | 0x10;
  TimerEvent::SetTimerCallBack(local_78,cb,param);
  local_68._0_8_ = &this->_timer_id_mutex;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  uVar8 = this->_timer_id_creater + 1;
  this->_timer_id_creater = uVar8;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  pVar6 = pthread_self();
  this_00._M_pi = local_70._M_pi;
  pTVar4 = local_78;
  if (pVar6 == (this->_local_thread_id)._M_thread) {
    peVar3 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48 = &local_78->super_TimerSlot;
    if (local_78 == (element_type *)0x0) {
      local_48 = (TimerSlot *)0x0;
    }
    local_40 = local_70._M_pi;
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70._M_pi)->_M_weak_count = (local_70._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_70._M_pi)->_M_weak_count = (local_70._M_pi)->_M_weak_count + 1;
      }
    }
    (**peVar3->_vptr_Timer)(peVar3,&local_48,(ulong)interval,(ulong)always);
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &local_40->_M_weak_count;
        iVar5 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar5 = local_40->_M_weak_count;
        local_40->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*local_40->_vptr__Sp_counted_base[3])();
      }
    }
    __all_timer_event_map::__tls_init();
    local_68._0_8_ = ZEXT48(uVar8);
    pmVar7 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(*in_FS_OFFSET + -0xc0),(key_type *)local_68);
    (pmVar7->super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_78;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar7->super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&local_70);
    (*((this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_EventActions[0xb])();
  }
  else {
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      }
    }
    local_58 = (_Manager_type)0x0;
    p_Stack_50 = (_Invoker_type)0x0;
    local_68._0_8_ = (mutex_type *)0x0;
    local_68._8_8_ = 0;
    local_68._0_8_ = operator_new(0x28);
    (((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex.__align = (long)pTVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex + 8) = this_00._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      }
    }
    (((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex.__data.__kind = uVar8;
    *(uint32_t *)((long)&(((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex + 0x14) =
         interval;
    (((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex.__size[0x18] = always;
    *(undefined4 *)((long)&(((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex + 0x19) =
         local_37;
    *(uint *)((long)&(((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex + 0x1c) =
         CONCAT31(uStack_33,local_37._3_1_);
    (((mutex_type *)local_68._0_8_)->super___mutex_base)._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)this;
    p_Stack_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:144:21)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:144:21)>
               ::_M_manager;
    PostTask(this,(Task *)local_68);
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)((_Any_data *)local_68,(_Any_data *)local_68,__destroy_functor);
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  return uVar8;
}

Assistant:

uint32_t Dispatcher::AddTimer(const user_timer_call_back& cb, void* param, uint32_t interval, bool always) {
    std::shared_ptr<TimerEvent> event = std::make_shared<TimerEvent>();
    event->AddType(ET_USER_TIMER);
    event->SetTimerCallBack(cb, param);

    uint32_t timer_id = MakeTimerID();

    if (std::this_thread::get_id() == _local_thread_id) {
        _timer->AddTimer(event, interval, always);
        __all_timer_event_map[timer_id] = event;
        _event_actions->Wakeup();
        
    } else {
        auto task = [event, timer_id, interval, always, this]() {
            _timer->AddTimer(event, interval, always);
            __all_timer_event_map[timer_id] = event;
        };
        PostTask(task);
    }
    return timer_id;
}